

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Fire_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::LE_Fire_PDU::checkFlagsAndPDULength(LE_Fire_PDU *this)

{
  LE_EntityIdentifier *pLVar1;
  KUINT16 *pKVar2;
  byte bVar3;
  KUINT8 KVar4;
  KUINT8 KVar5;
  short sVar6;
  
  bVar3 = (this->m_FireFlagUnion).m_ui8Flag;
  if ((bVar3 & 4) == 0) {
    if ((bVar3 & 2) != 0) {
      bVar3 = bVar3 & 0xf9;
LAB_00153633:
      sVar6 = -2;
LAB_00153687:
      (this->m_FireFlagUnion).m_ui8Flag = bVar3;
      pKVar2 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
      *pKVar2 = *pKVar2 + sVar6;
    }
  }
  else {
    pLVar1 = &(this->super_LE_Header).m_EntID;
    KVar4 = DATA_TYPE::LE_EntityIdentifier::GetSiteID(pLVar1);
    KVar5 = DATA_TYPE::LE_EntityIdentifier::GetSiteID(&this->m_MunitionID);
    if (KVar4 == KVar5) {
      KVar4 = DATA_TYPE::LE_EntityIdentifier::GetApplicationID(pLVar1);
      KVar5 = DATA_TYPE::LE_EntityIdentifier::GetApplicationID(&this->m_MunitionID);
      if (KVar4 == KVar5) {
        if (((this->m_FireFlagUnion).m_ui8Flag & 2) != 0) {
          bVar3 = (this->m_FireFlagUnion).m_ui8Flag & 0xfd;
          goto LAB_00153633;
        }
        goto LAB_0015368e;
      }
    }
    if (((this->m_FireFlagUnion).m_ui8Flag & 2) == 0) {
      bVar3 = (this->m_FireFlagUnion).m_ui8Flag | 2;
      sVar6 = 2;
      goto LAB_00153687;
    }
  }
LAB_0015368e:
  pLVar1 = &(this->super_LE_Header).m_EntID;
  KVar4 = DATA_TYPE::LE_EntityIdentifier::GetSiteID(pLVar1);
  KVar5 = DATA_TYPE::LE_EntityIdentifier::GetSiteID(&this->m_EventID);
  if (KVar4 == KVar5) {
    KVar4 = DATA_TYPE::LE_EntityIdentifier::GetApplicationID(pLVar1);
    KVar5 = DATA_TYPE::LE_EntityIdentifier::GetApplicationID(&this->m_EventID);
    if (KVar4 == KVar5) {
      if (((this->m_FireFlagUnion).m_ui8Flag & 8) == 0) {
        return;
      }
      bVar3 = (this->m_FireFlagUnion).m_ui8Flag & 0xf7;
      sVar6 = -2;
      goto LAB_001536e0;
    }
  }
  if (((this->m_FireFlagUnion).m_ui8Flag & 8) != 0) {
    return;
  }
  bVar3 = (this->m_FireFlagUnion).m_ui8Flag | 8;
  sVar6 = 2;
LAB_001536e0:
  (this->m_FireFlagUnion).m_ui8Flag = bVar3;
  pKVar2 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar2 = *pKVar2 + sVar6;
  return;
}

Assistant:

void LE_Fire_PDU::checkFlagsAndPDULength()
{
    // Check if Munition ID field is included and set dependent
    // values accordingly.
    if( GetMunitionEntityIDFlag() )
    {
        // Check if the munition's's site and application values
        // are the same, if they are we don't include them.
        if( m_EntID.GetSiteID() == m_MunitionID.GetSiteID() &&
                m_EntID.GetApplicationID() == m_MunitionID.GetApplicationID() )
        {
            // They match so don't include the fields
            SetMunitionEntityIDSiteAppIncludedFlag( false );
        }
        else
        {
            // They don't match so we need to send these fields.
            SetMunitionEntityIDSiteAppIncludedFlag( true );
        }
    }
    else
    {
        SetMunitionEntityIDSiteAppIncludedFlag( false );
    }

    // Now check the event's site and application values
    if( m_EntID.GetSiteID() == m_EventID.GetSiteID() &&
            m_EntID.GetApplicationID() == m_EventID.GetApplicationID() )
    {
        SetEventIDSiteAppIncludedFlag( false );
    }
    else
    {
        SetEventIDSiteAppIncludedFlag( true );
    }

#ifdef _DEBUG
    {
        // Verify PDU length
        const KUINT16 ui16ExpectedPDULength = 35
            + (4*m_FireFlagUnion.m_ui8TargetId)
            + ((2*m_FireFlagUnion.m_ui8MunitionSiteApp + 2)*m_FireFlagUnion.m_ui8MunitionId)
            + (2*m_FireFlagUnion.m_ui8EventSiteAppId)
            + (8*m_FireFlagUnion.m_ui8Location)
            + (4*m_FireFlagUnion.m_ui8WarheadFuse)
            + (4*m_FireFlagUnion.m_ui8QuantRate);
        assert(ui16ExpectedPDULength == m_ui16PDULength);
    }
#endif
}